

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_loremaster.cpp
# Opt level: O2

int AF_A_LoremasterChain(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  double dVar2;
  bool bVar3;
  AActor *ent;
  char *__assertion;
  FName FStack_78;
  FName local_74;
  FName local_70;
  FSoundID local_6c;
  DVector3 local_68;
  undefined1 local_48 [16];
  double local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054c9c5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_0054c808:
        ent = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054c9c5;
        }
      }
      if (numparam == 1) goto LAB_0054c888;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054c9b5;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054c9c5;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054c9b5;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054c888:
        local_6c.ID = S_FindSound("loremaster/active");
        S_Sound(ent,4,&local_6c,1.0,1.0);
        FName::FName(&local_70,"LoreShot2");
        local_68.X = (ent->__Pos).X;
        local_68.Y = (ent->__Pos).Y;
        local_68.Z = (ent->__Pos).Z;
        Spawn(&local_70,&local_68,ALLOW_REPLACE);
        FName::FName(&local_74,"LoreShot2");
        local_38 = (ent->Vel).Z * -0.5;
        dVar2 = (ent->Vel).Y * -0.5;
        local_48._8_4_ = SUB84(dVar2,0);
        local_48._0_8_ = (ent->Vel).X * -0.5;
        local_48._12_4_ = (int)((ulong)dVar2 >> 0x20);
        AActor::Vec3Offset(&local_68,ent,(DVector3 *)local_48,false);
        Spawn(&local_74,&local_68,ALLOW_REPLACE);
        FName::FName(&FStack_78,"LoreShot2");
        local_48._0_8_ = (ulong)(ent->Vel).X ^ 0x8000000000000000;
        local_48._8_4_ = *(undefined4 *)&(ent->Vel).Y;
        local_48._12_4_ = *(uint *)((long)&(ent->Vel).Y + 4) ^ 0x80000000;
        local_38 = -(ent->Vel).Z;
        AActor::Vec3Offset(&local_68,ent,(DVector3 *)local_48,false);
        Spawn(&FStack_78,&local_68,ALLOW_REPLACE);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054c9c5;
    }
    if (ent == (AActor *)0x0) goto LAB_0054c808;
  }
LAB_0054c9b5:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054c9c5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                ,0x24,"int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LoremasterChain)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_BODY, "loremaster/active", 1, ATTN_NORM);
	Spawn("LoreShot2", self->Pos(), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel/2.), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel), ALLOW_REPLACE);
	return 0;
}